

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void whereAddIndexedExpr(Parse *pParse,Index *pIdx,int iIdxCur,SrcItem *pTabItem)

{
  Table *pTab;
  Column *pCVar1;
  int iVar2;
  long lVar3;
  IndexedExpr *pIVar4;
  Expr *pEVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  void *pArg;
  
  pTab = pIdx->pTable;
  lVar7 = 4;
  uVar8 = 0;
  do {
    if (pIdx->nColumn <= uVar8) {
      return;
    }
    lVar3 = (long)pIdx->aiColumn[uVar8];
    if (lVar3 == -2) {
      pEVar5 = *(Expr **)((long)pIdx->aColExpr->a + lVar7 * 2 + -8);
LAB_0018749f:
      iVar2 = sqlite3ExprIsConstant((Parse *)0x0,pEVar5);
      if (iVar2 == 0) {
        pIVar4 = (IndexedExpr *)sqlite3DbMallocRaw(pParse->db,0x20);
        if (pIVar4 == (IndexedExpr *)0x0) {
          return;
        }
        pIVar4->pIENext = pParse->pIdxEpr;
        pEVar5 = sqlite3ExprDup(pParse->db,pEVar5,0);
        pIVar4->pExpr = pEVar5;
        pIVar4->iDataCur = pTabItem->iCursor;
        pIVar4->iIdxCur = iIdxCur;
        pIVar4->iIdxCol = (int)uVar8;
        pIVar4->bMaybeNullRow = ((pTabItem->fg).jointype & 0x58) != 0;
        pcVar6 = sqlite3IndexAffinityStr(pParse->db,pIdx);
        if (pcVar6 != (char *)0x0) {
          pIVar4->aff = pIdx->zColAff[uVar8];
        }
        pParse->pIdxEpr = pIVar4;
        if (pIVar4->pIENext == (IndexedExpr *)0x0) {
          sqlite3ParserAddCleanup(pParse,whereIndexedExprCleanup,&pParse->pIdxEpr);
        }
      }
    }
    else if (-1 < pIdx->aiColumn[uVar8]) {
      pCVar1 = pTab->aCol;
      if ((pCVar1[lVar3].colFlags & 0x20) != 0) {
        pEVar5 = sqlite3ColumnExpr(pTab,pCVar1 + lVar3);
        goto LAB_0018749f;
      }
    }
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 0xc;
  } while( true );
}

Assistant:

static SQLITE_NOINLINE void whereAddIndexedExpr(
  Parse *pParse,     /* Add IndexedExpr entries to pParse->pIdxEpr */
  Index *pIdx,       /* The index-on-expression that contains the expressions */
  int iIdxCur,       /* Cursor number for pIdx */
  SrcItem *pTabItem  /* The FROM clause entry for the table */
){
  int i;
  IndexedExpr *p;
  Table *pTab;
  assert( pIdx->bHasExpr );
  pTab = pIdx->pTable;
  for(i=0; i<pIdx->nColumn; i++){
    Expr *pExpr;
    int j = pIdx->aiColumn[i];
    if( j==XN_EXPR ){
      pExpr = pIdx->aColExpr->a[i].pExpr;
    }else if( j>=0 && (pTab->aCol[j].colFlags & COLFLAG_VIRTUAL)!=0 ){
      pExpr = sqlite3ColumnExpr(pTab, &pTab->aCol[j]);
    }else{
      continue;
    }
    if( sqlite3ExprIsConstant(0,pExpr) ) continue;
    p = sqlite3DbMallocRaw(pParse->db,  sizeof(IndexedExpr));
    if( p==0 ) break;
    p->pIENext = pParse->pIdxEpr;
#ifdef WHERETRACE_ENABLED
    if( sqlite3WhereTrace & 0x200 ){
      sqlite3DebugPrintf("New pParse->pIdxEpr term {%d,%d}\n", iIdxCur, i);
      if( sqlite3WhereTrace & 0x5000 ) sqlite3ShowExpr(pExpr);
    }
#endif
    p->pExpr = sqlite3ExprDup(pParse->db, pExpr, 0);
    p->iDataCur = pTabItem->iCursor;
    p->iIdxCur = iIdxCur;
    p->iIdxCol = i;
    p->bMaybeNullRow = (pTabItem->fg.jointype & (JT_LEFT|JT_LTORJ|JT_RIGHT))!=0;
    if( sqlite3IndexAffinityStr(pParse->db, pIdx) ){
      p->aff = pIdx->zColAff[i];
    }
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
    p->zIdxName = pIdx->zName;
#endif
    pParse->pIdxEpr = p;
    if( p->pIENext==0 ){
      void *pArg = (void*)&pParse->pIdxEpr;
      sqlite3ParserAddCleanup(pParse, whereIndexedExprCleanup, pArg);
    }
  }
}